

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::HttpInputStream::Response> * __thiscall
kj::_::NullableValue<kj::HttpInputStream::Response>::operator=
          (NullableValue<kj::HttpInputStream::Response> *this,
          NullableValue<kj::HttpInputStream::Response> *other)

{
  Response *params;
  NullableValue<kj::HttpInputStream::Response> *other_local;
  NullableValue<kj::HttpInputStream::Response> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::HttpInputStream::Response>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::HttpInputStream::Response>(&(other->field_1).value);
      ctor<kj::HttpInputStream::Response,kj::HttpInputStream::Response>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }